

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BOOL LOADCallDllMainSafe(MODSTRUCT *module,DWORD dwReason,LPVOID lpReserved)

{
  int new_level;
  BOOL BVar1;
  PAL_LeaveHolder local_49;
  MODSTRUCT *pMStack_48;
  PAL_LeaveHolder holder;
  Param param;
  int old_level;
  LPVOID lpReserved_local;
  DWORD dwReason_local;
  MODSTRUCT *module_local;
  
  new_level = DBG_change_entrylevel(0);
  pMStack_48 = module;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  PAL_LeaveHolder::PAL_LeaveHolder(&local_49);
  BVar1 = (*pMStack_48->pDllMain)(pMStack_48->hinstance,dwReason,lpReserved);
  PAL_LeaveHolder::~PAL_LeaveHolder(&local_49);
  DBG_change_entrylevel(new_level);
  return BVar1;
}

Assistant:

static BOOL LOADCallDllMainSafe(MODSTRUCT *module, DWORD dwReason, LPVOID lpReserved)
{
#if _ENABLE_DEBUG_MESSAGES_
    /* reset ENTRY nesting level back to zero while inside the callback... */
    int old_level = DBG_change_entrylevel(0);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

    struct Param
    {
        MODSTRUCT *module;
        DWORD dwReason;
        LPVOID lpReserved;
        BOOL ret;
    } param;
    param.module = module;
    param.dwReason = dwReason;
    param.lpReserved = lpReserved;
    param.ret = FALSE;

    {
        TRACE("Calling DllMain (%p) for module %S\n",
              param.module->pDllMain,
              param.module->lib_name ? param.module->lib_name : W16_NULLSTRING);

        {
            // This module may be foreign to our PAL, so leave our PAL.
            // If it depends on us, it will re-enter.
            PAL_LeaveHolder holder;
            param.ret = param.module->pDllMain(param.module->hinstance, param.dwReason, param.lpReserved);
        }
    }

#if _ENABLE_DEBUG_MESSAGES_
    /* ...and set nesting level back to what it was */
    DBG_change_entrylevel(old_level);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

    return param.ret;
}